

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelBuilder.cpp
# Opt level: O3

uint __thiscall FMB::FiniteModelBuilder::estimateInstanceCount(FiniteModelBuilder *this)

{
  uint uVar1;
  Clause *this_00;
  uint uVar2;
  Clause *in_RAX;
  Entry *pEVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ClauseList *pCVar7;
  uint uVar8;
  Clause *local_38;
  
  pCVar7 = this->_clauses;
  if (pCVar7 == (ClauseList *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    local_38 = in_RAX;
    do {
      this_00 = pCVar7->_head;
      pCVar7 = pCVar7->_tail;
      uVar2 = Kernel::Clause::varCnt(this_00);
      local_38 = this_00;
      pEVar3 = Lib::
               DHMap<Kernel::Clause_*,_Lib::DArray<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
               ::findEntry(&this->_clauseVariableSorts,&local_38);
      if (pEVar3->_val != (DArray<unsigned_int> *)0x0) {
        if (uVar2 == 0) {
          iVar4 = 1;
        }
        else {
          iVar4 = 1;
          uVar5 = 0;
          do {
            uVar6 = pEVar3->_val->_array[uVar5];
            uVar1 = (this->_sortedSignature->sortBounds)._array[uVar6];
            uVar6 = (this->_distinctSortSizes)._array
                    [(this->_sortedSignature->parents)._array[uVar6]];
            if (uVar1 < uVar6) {
              uVar6 = uVar1;
            }
            iVar4 = iVar4 * uVar6;
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
        uVar8 = uVar8 + iVar4;
      }
    } while (pCVar7 != (List<Kernel::Clause_*> *)0x0);
  }
  return uVar8;
}

Assistant:

unsigned FiniteModelBuilder::estimateInstanceCount()
{
  unsigned res = 0;
  ClauseList::Iterator cit(_clauses);

  while(cit.hasNext()){
    unsigned instances = 1;

    Clause* c = cit.next();
    unsigned vars = c->varCnt();
    const DArray<unsigned>* varSorts = _clauseVariableSorts.get(c) ;
    if(!varSorts){
      continue;
    }

    for(unsigned var=0;var<vars;var++){
      unsigned srt = (*varSorts)[var];
      instances *= min(_distinctSortSizes[_sortedSignature->parents[srt]],_sortedSignature->sortBounds[srt]);
    }

    res += instances;
  }
  return res;
}